

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O0

void penguinV::GammaCorrection
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,double a,double gamma)

{
  bool bVar1;
  ImageTypeManager *this;
  FunctionTableHolder *pFVar2;
  reference puVar3;
  Image *in_RCX;
  uint32_t in_EDX;
  uint32_t in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint32_t in_R8D;
  uint32_t in_R9D;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  uint32_t in_stack_00000008;
  uint32_t in_stack_00000010;
  ImageManager manager;
  GammaCorrectionForm4 funcTemp;
  const_iterator type;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *types;
  uint8_t imageType;
  GammaCorrectionForm4 func;
  ImageTypeManager *registrator;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  uint8_t requiredType;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  ImageTypeManager *in_stack_fffffffffffffee0;
  ImageManager *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  uint8_t in_stack_ffffffffffffff0f;
  ImageTypeManager *in_stack_ffffffffffffff10;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_78;
  undefined1 local_70 [24];
  undefined1 *local_58;
  uint8_t local_49;
  GammaCorrectionForm4 functionName;
  GammaCorrectionForm4 p_Var4;
  ImageTypeManager *pIVar5;
  
  this = ImageTypeManager::instance();
  PenguinV_Image::ImageTemplate<unsigned_char>::type(in_RDI);
  pFVar2 = ImageTypeManager::functionTable(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0f);
  functionName = pFVar2->GammaCorrection;
  local_49 = PenguinV_Image::ImageTemplate<unsigned_char>::type(in_RDI);
  if ((functionName == (GammaCorrectionForm4)0x0) &&
     (bVar1 = ImageTypeManager::isIntertypeConversionEnabled(this), bVar1)) {
    ImageTypeManager::imageTypes
              ((ImageTypeManager *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    local_58 = local_70;
    local_78._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    while( true ) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      if (!bVar1) break;
      pIVar5 = this;
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator*(&local_78);
      pFVar2 = ImageTypeManager::functionTable(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0f);
      p_Var4 = pFVar2->GammaCorrection;
      if (p_Var4 != (GammaCorrectionForm4)0x0) {
        puVar3 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator*(&local_78);
        local_49 = *puVar3;
        in_stack_fffffffffffffee0 = this;
        functionName = p_Var4;
        this = pIVar5;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++(&local_78);
      in_stack_fffffffffffffee0 = this;
      this = pIVar5;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffee0);
  }
  requiredType = (uint8_t)((uint)in_stack_fffffffffffffecc >> 0x18);
  (anonymous_namespace)::
  verifyFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,double,double)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_double_double
              *)this,(char *)functionName);
  anon_unknown.dwarf_84a6f::ImageManager::ImageManager
            ((ImageManager *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             requiredType);
  (*functionName)(in_RDI,in_ESI,in_EDX,in_RCX,in_R8D,in_R9D,in_stack_00000008,in_stack_00000010,
                  in_XMM0_Qa,in_XMM1_Qa);
  anon_unknown.dwarf_84a6f::ImageManager::~ImageManager(in_stack_ffffffffffffff00);
  return;
}

Assistant:

void GammaCorrection( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                          uint32_t width, uint32_t height, double a, double gamma )
    {
        initialize( in, GammaCorrection )
        func( in, startXIn, startYIn, out, startXOut, startYOut, width, height, a, gamma );
    }